

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  pointer pMVar2;
  ostream *poVar3;
  pluralise local_50;
  ColourGuard local_38;
  
  pMVar1 = (this->itMessage)._M_current;
  pMVar2 = (this->messages->
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar1 != pMVar2) {
    poVar3 = this->stream;
    local_38.m_colourImpl = this->colourImpl;
    local_38.m_engaged = false;
    local_38.m_code = colour;
    ColourImpl::ColourGuard::engageImpl(&local_38,poVar3);
    poVar3 = std::operator<<(poVar3," with ");
    local_50.m_label.m_start = "message";
    local_50.m_label.m_size = 7;
    local_50.m_count = (uint64_t)(((long)pMVar2 - (long)pMVar1) / 0x48);
    Catch::operator<<(poVar3,&local_50);
    std::operator<<(poVar3,':');
    ColourImpl::ColourGuard::~ColourGuard(&local_38);
    while (pMVar1 = (this->itMessage)._M_current, pMVar1 != pMVar2) {
      if ((this->printInfoMessages == false) && (pMVar1->type == Info)) {
        (this->itMessage)._M_current = pMVar1 + 1;
      }
      else {
        printMessage(this);
        if ((this->itMessage)._M_current != pMVar2) {
          poVar3 = this->stream;
          local_50.m_count = (uint64_t)this->colourImpl;
          local_50.m_label.m_start = (char *)CONCAT35(local_50.m_label.m_start._5_3_,0x17);
          ColourImpl::ColourGuard::engageImpl((ColourGuard *)&local_50,poVar3);
          std::operator<<(poVar3," and");
          ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_50);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = compactDimColour) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(itEnd - itMessage);

        stream << colourImpl->guardColour( colour ) << " with "
               << pluralise( N, "message"_sr ) << ':';

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    stream << colourImpl->guardColour(compactDimColour) << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }